

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O1

int adiak_hostlist(void)

{
  return -1;
}

Assistant:

int adiak_hostlist()
{
   char **hostlist_array = NULL;
   int num_hosts = 0, result = -1;

#if defined(USE_MPI)
   char *name_buffer = NULL;
   if (adiak_config->use_mpi)
      result = adksys_hostlist(&hostlist_array, &num_hosts, &name_buffer, adiak_config->report_on_all_ranks);
#endif
   if (result == -1)
      return -1;

   if (hostlist_array)
      result = adiak_namevalue("hostlist", adiak_general, "host", "[%s]", hostlist_array, num_hosts);

   return result;
}